

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiniteModelMultiSorted.cpp
# Opt level: O0

bool __thiscall
FMB::FiniteModelMultiSorted::evaluate(FiniteModelMultiSorted *this,Formula *formula,uint depth)

{
  bool bVar1;
  Connective CVar2;
  uint uVar3;
  List<unsigned_int> *pLVar4;
  Formula *pFVar5;
  Formula *pFVar6;
  undefined8 uVar7;
  Term *pTVar8;
  uint *puVar9;
  UserErrorException *this_00;
  socklen_t __len;
  undefined4 in_EDX;
  FiniteModelMultiSorted *in_RSI;
  DArray<unsigned_int> *in_RDI;
  bool res_1;
  Formula *next_sub;
  Substitution s;
  uint c;
  uint srtU;
  TermList srt;
  Formula *next;
  int var;
  VList *vs;
  bool right_res;
  bool left_res;
  Formula *right;
  Formula *left;
  bool res;
  Formula *arg;
  Iterator fit;
  FormulaList *args;
  Literal *lit;
  bool isForall;
  bool isXor;
  bool isImp;
  bool isAnd;
  string *in_stack_fffffffffffffd58;
  UserErrorException *in_stack_fffffffffffffd60;
  undefined7 in_stack_fffffffffffffd68;
  undefined1 in_stack_fffffffffffffd6f;
  VList *in_stack_fffffffffffffd70;
  undefined8 in_stack_fffffffffffffd78;
  Connective con;
  QuantifiedFormula *in_stack_fffffffffffffd80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffd9c;
  uint uVar10;
  Formula *in_stack_fffffffffffffda0;
  undefined8 in_stack_fffffffffffffda8;
  int i;
  bool local_239;
  uint in_stack_fffffffffffffe60;
  uint in_stack_fffffffffffffe64;
  FiniteModelMultiSorted *in_stack_fffffffffffffe68;
  Entry *in_stack_fffffffffffffe70;
  Formula *in_stack_fffffffffffffe78;
  uint in_stack_fffffffffffffe80;
  uint local_17c;
  TermList local_d0;
  Formula *local_c8;
  uint local_bc;
  List<unsigned_int> *local_b8;
  byte local_a9;
  Formula *local_a8;
  Formula *local_a0;
  undefined1 local_91;
  Formula *local_90;
  Iterator local_88;
  FormulaList *local_80;
  undefined1 local_75;
  undefined8 in_stack_ffffffffffffffd8;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  bool local_1;
  
  i = (int)((ulong)in_stack_fffffffffffffda8 >> 0x20);
  con = (Connective)((ulong)in_stack_fffffffffffffd78 >> 0x20);
  bVar14 = 0;
  bVar13 = 0;
  bVar12 = 0;
  bVar11 = 0;
  CVar2 = Kernel::Formula::connective((Formula *)in_RSI);
  uVar3 = (uint)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  switch(CVar2) {
  case LITERAL:
    Kernel::Formula::literal((Formula *)0x2d9e90);
    bVar1 = Kernel::Term::ground((Term *)0x2d9ea5);
    if (!bVar1) {
      local_75 = 1;
      uVar7 = __cxa_allocate_exception(0x50);
      Kernel::Formula::toString_abi_cxx11_(left);
      std::operator+((char *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd60);
      Lib::UserErrorException::Exception(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
      local_75 = 0;
      __cxa_throw(uVar7,&Lib::UserErrorException::typeinfo,
                  Lib::UserErrorException::~UserErrorException);
    }
    local_1 = evaluateGroundLiteral
                        (in_RSI,(Literal *)
                                CONCAT44(in_EDX,CONCAT13(bVar14,CONCAT12(bVar13,CONCAT11(bVar12,
                                                  bVar11)))));
    break;
  case AND:
    bVar14 = 1;
  case OR:
    local_80 = Kernel::Formula::args((Formula *)0x2da02a);
    Lib::List<Kernel::Formula_*>::Iterator::Iterator(&local_88,local_80);
    do {
      bVar1 = Lib::List<Kernel::Formula_*>::Iterator::hasNext((Iterator *)0x2da054);
      if (!bVar1) {
        local_1 = (bool)(bVar14 & 1);
        goto LAB_002da873;
      }
      local_90 = Lib::List<Kernel::Formula_*>::Iterator::next((Iterator *)in_stack_fffffffffffffd60)
      ;
      local_91 = evaluate(in_RSI,(Formula *)
                                 CONCAT44(in_EDX,CONCAT13(bVar14,CONCAT12(bVar13,CONCAT11(bVar12,
                                                  bVar11)))),
                          (uint)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
      if (((bVar14 & 1) != 0) && (!(bool)local_91)) {
        local_1 = false;
        goto LAB_002da873;
      }
    } while (((bVar14 & 1) != 0) || (!(bool)local_91));
    local_1 = true;
    break;
  case IMP:
    bVar13 = 1;
  case XOR:
    bVar12 = (bVar13 ^ 0xff) & 1;
  case IFF:
    local_a0 = Kernel::Formula::left((Formula *)0x2da11a);
    local_a8 = Kernel::Formula::right((Formula *)0x2da12f);
    local_a9 = evaluate(in_RSI,(Formula *)
                               CONCAT44(in_EDX,CONCAT13(bVar14,CONCAT12(bVar13,CONCAT11(bVar12,
                                                  bVar11)))),uVar3);
    if (((bVar13 & 1) == 0) || ((bool)local_a9)) {
      bVar1 = evaluate(in_RSI,(Formula *)
                              CONCAT44(in_EDX,CONCAT13(bVar14,CONCAT12(bVar13,CONCAT11(bVar12,bVar11
                                                                                      )))),uVar3);
      if ((bVar13 & 1) == 0) {
        if ((bVar12 & 1) == 0) {
          local_1 = (bool)(local_a9 & 1) == bVar1;
        }
        else {
          local_1 = (bool)(local_a9 & 1) != bVar1;
        }
      }
      else {
        local_239 = true;
        if ((local_a9 & 1) != 0) {
          local_239 = bVar1;
        }
        local_1 = local_239;
      }
    }
    else {
      local_1 = true;
    }
    break;
  case NOT:
    Kernel::Formula::uarg((Formula *)0x2d9fee);
    bVar1 = evaluate(in_RSI,(Formula *)
                            CONCAT44(in_EDX,CONCAT13(bVar14,CONCAT12(bVar13,CONCAT11(bVar12,bVar11))
                                                    )),uVar3);
    local_1 = (bool)((bVar1 ^ 0xffU) & 1);
    break;
  case FORALL:
    bVar11 = 1;
  case EXISTS:
    local_b8 = Kernel::Formula::vars((Formula *)0x2da250);
    local_bc = Lib::List<unsigned_int>::head(local_b8);
    local_c8 = (Formula *)0x0;
    pLVar4 = Lib::List<unsigned_int>::tail(local_b8);
    if (pLVar4 == (List<unsigned_int> *)0x0) {
      local_c8 = Kernel::Formula::qarg((Formula *)0x2da33b);
    }
    else {
      pFVar5 = (Formula *)Kernel::QuantifiedFormula::operator_new(0x2da299);
      Kernel::Formula::connective((Formula *)in_RSI);
      Lib::List<unsigned_int>::tail(local_b8);
      pFVar6 = Kernel::Formula::qarg((Formula *)0x2da2d2);
      i = (int)((ulong)pFVar6 >> 0x20);
      Kernel::QuantifiedFormula::QuantifiedFormula
                (in_stack_fffffffffffffd80,con,in_stack_fffffffffffffd70,
                 (SList *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),
                 (Formula *)in_stack_fffffffffffffd60);
      local_c8 = pFVar5;
    }
    Kernel::TermList::TermList(&local_d0);
    bVar1 = Kernel::SortHelper::tryGetVariableSort
                      (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                       (TermList *)in_stack_fffffffffffffe70);
    if (!bVar1) {
      uVar7 = __cxa_allocate_exception(0x50);
      Lib::Int::toString_abi_cxx11_(i);
      std::operator+((char *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd60);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),
                     (char *)in_stack_fffffffffffffd60);
      Kernel::Formula::toString_abi_cxx11_(left);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                     in_stack_fffffffffffffd90);
      Lib::UserErrorException::Exception(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
      __cxa_throw(uVar7,&Lib::UserErrorException::typeinfo,
                  Lib::UserErrorException::~UserErrorException);
    }
    pTVar8 = Kernel::TermList::term((TermList *)0x2da53d);
    uVar3 = Kernel::Term::functor(pTVar8);
    local_17c = 1;
    while (uVar10 = local_17c, puVar9 = Lib::DArray<unsigned_int>::operator[](in_RDI,(ulong)uVar3),
          uVar10 <= *puVar9) {
      Kernel::Substitution::Substitution((Substitution *)0x2da591);
      uVar10 = local_bc;
      __len = (socklen_t)puVar9;
      pTVar8 = getDomainConstant(in_stack_fffffffffffffe68,in_stack_fffffffffffffe64,
                                 in_stack_fffffffffffffe60);
      Kernel::Substitution::bind
                ((Substitution *)&stack0xfffffffffffffe58,uVar10,(sockaddr *)pTVar8,__len);
      Kernel::SubstHelper::apply<Kernel::Substitution>
                ((Formula *)in_stack_fffffffffffffd60,(Substitution *)in_stack_fffffffffffffd58);
      Shell::SimplifyFalseTrue::simplify(in_stack_fffffffffffffda0);
      Shell::Flattening::flatten(in_stack_fffffffffffffda0);
      bVar1 = evaluate(in_RSI,(Formula *)
                              CONCAT44(in_EDX,CONCAT13(bVar14,CONCAT12(bVar13,CONCAT11(bVar12,bVar11
                                                                                      )))),
                       (uint)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
      if (((bVar11 & 1) == 0) || (bVar1)) {
        if (((bVar11 & 1) == 0) && (bVar1)) {
          local_1 = true;
          bVar1 = true;
        }
        else {
          bVar1 = false;
        }
      }
      else {
        local_1 = false;
        bVar1 = true;
      }
      Kernel::Substitution::~Substitution((Substitution *)0x2da6fc);
      if (bVar1) goto LAB_002da873;
      local_17c = local_17c + 1;
    }
    local_1 = (bool)(bVar11 & 1);
    break;
  default:
    this_00 = (UserErrorException *)__cxa_allocate_exception(0x50);
    Kernel::Formula::toString_abi_cxx11_(left);
    std::operator+((char *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),(char *)this_00);
    Lib::UserErrorException::Exception(this_00,in_stack_fffffffffffffd58);
    __cxa_throw(this_00,&Lib::UserErrorException::typeinfo,
                Lib::UserErrorException::~UserErrorException);
  case FALSE:
    local_1 = false;
    break;
  case TRUE:
    local_1 = true;
  }
LAB_002da873:
  return (bool)(local_1 & 1);
}

Assistant:

bool FiniteModelMultiSorted::evaluate(Formula* formula,unsigned depth)
{
#if DEBUG_MODEL
  for(unsigned i=0;i<depth;i++){ cout << "."; }
  cout << "Evaluating..." << formula->toString() << endl;
#endif

  bool isAnd = false;
  bool isImp = false;
  bool isXor = false;
  bool isForall = false;
  switch(formula->connective()){
    // If it's a literal evaluate that
    case LITERAL:
    {
      Literal* lit = formula->literal();
      if(!lit->ground()){
        USER_ERROR("Was not expecting free variables in "+formula->toString());
      }
      return evaluateGroundLiteral(lit);
    }

    // Expand the standard ones
    case FALSE:
      return false;
    case TRUE:
      return true;
    case NOT:
      return !evaluate(formula->uarg(),depth+1);
    case AND:
      isAnd=true;
    case OR:
      {
        FormulaList* args = formula->args();
        FormulaList::Iterator fit(args);
        while(fit.hasNext()){
          Formula* arg = fit.next();
          bool res = evaluate(arg,depth+1);
          if(isAnd && !res) return false;
          if(!isAnd && res) return true;
        }
        return isAnd;
      }

    case IMP:
     isImp=true;
    case XOR:
     isXor = !isImp;
    case IFF:
    {
      Formula* left = formula->left();
      Formula* right = formula->right();
      bool left_res = evaluate(left,depth+1);
      if(isImp && !left_res) return true;
      bool right_res = evaluate(right,depth+1);

#if DEBUG_MODEL
      cout << "left_res is " << left_res << ", right_res is " << right_res << endl;
#endif

      if(isImp) return !left_res || right_res;
      if(isXor) return left_res != right_res;
      return left_res == right_res; // IFF
    }

    // Expand quantifications
    case FORALL:
     isForall = true;
    case EXISTS:
    {
     VList* vs = formula->vars();
     int var = vs->head();

     //cout << "Quant " << isForall << " with " << var << endl;

     Formula* next = 0;
     if(vs->tail()) next = new QuantifiedFormula(formula->connective(),vs->tail(),0,formula->qarg());
     else next = formula->qarg();

     TermList srt;
     if(!SortHelper::tryGetVariableSort(var,formula,srt)){
       USER_ERROR("Failed to get sort of "+Lib::Int::toString(var)+" in "+formula->toString());
     }

     unsigned srtU = srt.term()->functor();
     for(unsigned c=1;c<=_sizes[srtU];c++){
       Substitution s;
       s.bind(var,getDomainConstant(c,srtU));
       Formula* next_sub = SubstHelper::apply(next,s);
       next_sub = SimplifyFalseTrue::simplify(next_sub);
       next_sub = Flattening::flatten(next_sub);

       bool res = evaluate(next_sub,depth+1);

       //TODO try and limit memory issues!
       //     ideally delete the bits introduced by the application of SubstHelper::apply
       //if(next_sub!=next) next_sub->destroy();

       if(isForall && !res) return false;
       if(!isForall && res) return true;
     }

     return isForall;
    }
    default:
      USER_ERROR("Cannot evaluate " + formula->toString() + ", not supported");
  }

  NOT_IMPLEMENTED;
  return false;
}